

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

value __thiscall
implicit_value_suite::visitor::operator()
          (visitor *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  value vVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  undefined1 local_48 [8];
  variable data;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value_local;
  visitor *this_local;
  
  data.storage._40_8_ = value;
  std::__cxx11::wstring::wstring((wstring *)&local_68,(wstring *)value);
  trial::dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::wstring>
            ((basic_variable<std::allocator<char>> *)local_48,&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  vVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::code
                    ((basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return vVar1;
}

Assistant:

token::code::value operator()(T value)
    {
        variable data(std::move(value));
        return data.code();
    }